

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

uint32_t helper_absdif_ssov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  uint32_t uVar1;
  long arg;
  
  arg = (long)(int)r2 - (long)(int)r1;
  if ((int)r2 < (int)r1) {
    arg = (long)(int)r1 - (long)(int)r2;
  }
  uVar1 = ssov32(env,arg);
  return uVar1;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}